

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actions.hpp
# Opt level: O0

type __thiscall
boost::spirit::classic::
action<boost::spirit::classic::blank_parser,POMDPFormatParsing::ParserPOMDPFormat_Spirit::DebugOutput>
::
parse<boost::spirit::classic::scanner<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>>,boost::spirit::classic::file_position_base<std::__cxx11::string>,boost::spirit::classic::nil_t>,boost::spirit::classic::scanner_policies<boost::spirit::classic::no_skipper_iteration_policy<boost::spirit::classic::skip_parser_iteration_policy<comment_cbonlp::CommentBlankorNewLineParser,boost::spirit::classic::iteration_policy>>,boost::spirit::classic::match_policy,boost::spirit::classic::action_policy>>>
          (action<boost::spirit::classic::blank_parser,_POMDPFormatParsing::ParserPOMDPFormat_Spirit::DebugOutput>
           *this,scanner<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>,_boost::spirit::classic::scanner_policies<boost::spirit::classic::no_skipper_iteration_policy<boost::spirit::classic::skip_parser_iteration_policy<comment_cbonlp::CommentBlankorNewLineParser,_boost::spirit::classic::iteration_policy>_>,_boost::spirit::classic::match_policy,_boost::spirit::classic::action_policy>_>
                 *scan)

{
  DebugOutput *actor;
  undefined8 extraout_RDX;
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  *in_RSI;
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  *in_RDI;
  type tVar1;
  return_t val;
  iterator_t save;
  result_t *hit;
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  *in_stack_ffffffffffffff28;
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  *in_stack_ffffffffffffff30;
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  *iter;
  scanner<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>,_boost::spirit::classic::scanner_policies<boost::spirit::classic::no_skipper_iteration_policy<boost::spirit::classic::skip_parser_iteration_policy<comment_cbonlp::CommentBlankorNewLineParser,_boost::spirit::classic::iteration_policy>_>,_boost::spirit::classic::match_policy,_boost::spirit::classic::action_policy>_>
  *in_stack_ffffffffffffffc0;
  char_parser<boost::spirit::classic::blank_parser> *in_stack_ffffffffffffffc8;
  
  iter = in_RDI;
  scanner<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>,_boost::spirit::classic::scanner_policies<boost::spirit::classic::no_skipper_iteration_policy<boost::spirit::classic::skip_parser_iteration_policy<comment_cbonlp::CommentBlankorNewLineParser,_boost::spirit::classic::iteration_policy>_>,_boost::spirit::classic::match_policy,_boost::spirit::classic::action_policy>_>
  ::at_end((scanner<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>,_boost::spirit::classic::scanner_policies<boost::spirit::classic::no_skipper_iteration_policy<boost::spirit::classic::skip_parser_iteration_policy<comment_cbonlp::CommentBlankorNewLineParser,_boost::spirit::classic::iteration_policy>_>,_boost::spirit::classic::match_policy,_boost::spirit::classic::action_policy>_>
            *)0xa7cf76);
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  ::position_iterator(in_RSI,iter);
  unary<boost::spirit::classic::blank_parser,_boost::spirit::classic::parser<boost::spirit::classic::action<boost::spirit::classic::blank_parser,_POMDPFormatParsing::ParserPOMDPFormat_Spirit::DebugOutput>_>_>
  ::subject((unary<boost::spirit::classic::blank_parser,_boost::spirit::classic::parser<boost::spirit::classic::action<boost::spirit::classic::blank_parser,_POMDPFormatParsing::ParserPOMDPFormat_Spirit::DebugOutput>_>_>
             *)in_RSI);
  char_parser<boost::spirit::classic::blank_parser>::
  parse<boost::spirit::classic::scanner<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>>,boost::spirit::classic::file_position_base<std::__cxx11::string>,boost::spirit::classic::nil_t>,boost::spirit::classic::scanner_policies<boost::spirit::classic::no_skipper_iteration_policy<boost::spirit::classic::skip_parser_iteration_policy<comment_cbonlp::CommentBlankorNewLineParser,boost::spirit::classic::iteration_policy>>,boost::spirit::classic::match_policy,boost::spirit::classic::action_policy>>>
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  actor = (DebugOutput *)
          safe_bool::operator_cast_to__
                    ((safe_bool<boost::spirit::classic::match<char>,_boost::spirit::classic::impl::no_base<boost::spirit::classic::match<char>_>_>
                      *)0xa7cfc5);
  if (actor != (DebugOutput *)0xffffffffffffffff) {
    in_stack_ffffffffffffff30 =
         (position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
          *)match<char>::value((match<char> *)0xa7cfe1);
    action_policy::
    do_action<POMDPFormatParsing::ParserPOMDPFormat_Spirit::DebugOutput,char_const,boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>>,boost::spirit::classic::file_position_base<std::__cxx11::string>,boost::spirit::classic::nil_t>>
              ((action_policy *)in_RDI,actor,(char *)in_stack_ffffffffffffff30,
               in_stack_ffffffffffffff28,
               (position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
                *)0xa7d016);
  }
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  ::~position_iterator(in_stack_ffffffffffffff30);
  tVar1._8_8_ = extraout_RDX;
  tVar1.len = (ptrdiff_t)iter;
  return tVar1;
}

Assistant:

typename parser_result<self_t, ScannerT>::type
        parse(ScannerT const& scan) const
        {
            typedef typename ScannerT::iterator_t iterator_t;
            typedef typename parser_result<self_t, ScannerT>::type result_t;

            scan.at_end(); // allow skipper to take effect
            iterator_t save = scan.first;
            result_t hit = this->subject().parse(scan);
            if (hit)
            {
                typename result_t::return_t val = hit.value();
                scan.do_action(actor, val, save, scan.first);
            }
            return hit;
        }